

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void VP8LHistogramCreate(VP8LHistogram *p,VP8LBackwardRefs *refs,int palette_code_bits)

{
  int in_EDX;
  VP8LHistogram *in_RSI;
  VP8LHistogram *in_RDI;
  undefined4 unaff_retaddr;
  
  if (-1 < in_EDX) {
    in_RDI->palette_code_bits_ = in_EDX;
  }
  HistogramClear(in_RSI);
  VP8LHistogramStoreRefs((VP8LBackwardRefs *)CONCAT44(palette_code_bits,unaff_retaddr),in_RDI);
  return;
}

Assistant:

void VP8LHistogramCreate(VP8LHistogram* const p,
                         const VP8LBackwardRefs* const refs,
                         int palette_code_bits) {
  if (palette_code_bits >= 0) {
    p->palette_code_bits_ = palette_code_bits;
  }
  HistogramClear(p);
  VP8LHistogramStoreRefs(refs, p);
}